

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O1

void __thiscall DIS::VariableDatum::unmarshal(VariableDatum *this,DataStream *dataStream)

{
  uint *d;
  pointer pEVar1;
  pointer pEVar2;
  pointer pEVar3;
  ulong uVar4;
  EightByteChunk x;
  EightByteChunk local_40;
  
  DataStream::operator>>(dataStream,&this->_variableDatumID);
  d = &this->_variableDatumLength;
  DataStream::operator>>(dataStream,d);
  this->_variableDatumLength =
       ((this->_variableDatumLength >> 6) + 1) - (uint)((this->_variableDatumLength & 0x3f) == 0);
  pEVar1 = (this->_variableDatums).
           super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (this->_variableDatums).
           super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar3 = pEVar1;
  if (pEVar2 != pEVar1) {
    do {
      (**pEVar3->_vptr_EightByteChunk)(pEVar3);
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar2);
    (this->_variableDatums).
    super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar1;
  }
  if (*d != 0) {
    uVar4 = 0;
    do {
      EightByteChunk::EightByteChunk(&local_40);
      EightByteChunk::unmarshal(&local_40,dataStream);
      std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::push_back
                (&this->_variableDatums,&local_40);
      EightByteChunk::~EightByteChunk(&local_40);
      uVar4 = uVar4 + 1;
    } while (uVar4 < *d);
  }
  return;
}

Assistant:

void VariableDatum::unmarshal(DataStream& dataStream)
{
    dataStream >> _variableDatumID;
    dataStream >> _variableDatumLength;
    _variableDatumLength = (_variableDatumLength / 64) + ((_variableDatumLength % 64) > 0);

     _variableDatums.clear();
     for(size_t idx = 0; idx < _variableDatumLength; idx++)
     {
        EightByteChunk x;
        x.unmarshal(dataStream);
        _variableDatums.push_back(x);
     }
}